

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  char *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  SyntaxNode *pSVar3;
  Expression *this;
  uint uVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  char cVar5;
  char cVar6;
  char cVar7;
  ASTContext *ctx;
  ConditionalExpressionSyntax *pCVar8;
  Compilation *pCVar9;
  TempVarSymbol *pTVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar17;
  uint64_t hash;
  InvalidPattern *pIVar18;
  undefined4 extraout_var_00;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar19;
  undefined7 extraout_var;
  Expression *pEVar20;
  Type *pTVar21;
  undefined4 extraout_var_01;
  Type *pTVar22;
  SourceLocation SVar23;
  Diagnostic *pDVar24;
  Diagnostic *pDVar25;
  SymbolKind SVar26;
  bitmask<slang::ast::ASTFlags> bVar27;
  EVP_PKEY_CTX *src;
  pointer ppPVar28;
  pointer ppPVar29;
  undefined8 uVar30;
  long lVar31;
  ulong uVar32;
  ulong pos0;
  long lVar33;
  byte bVar34;
  undefined7 uVar35;
  string_view *sv;
  Type *this_00;
  ulong uVar36;
  Type *pTVar37;
  undefined1 auVar38 [16];
  string_view arg;
  SourceRange range;
  bool isConst;
  bool isTrue;
  try_emplace_args_t local_269;
  ConditionalExpression *local_268;
  Expression *local_260;
  TempVarSymbol *local_258;
  ASTContext *local_250;
  ulong local_248;
  undefined8 local_240;
  Token *local_238;
  ConditionalExpressionSyntax *local_230;
  Compilation *local_228;
  ulong local_220;
  ASTContext trueContext;
  locator res;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>_>
  varMap;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> vars;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  
  isConst = true;
  isTrue = true;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_ =
       (pointer)conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
                firstElement;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.len = 0;
  conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.cap = 2;
  trueContext.assertionInstance = context->assertionInstance;
  trueContext.scope.ptr = (context->scope).ptr;
  trueContext.lookupIndex = context->lookupIndex;
  trueContext._12_4_ = *(undefined4 *)&context->field_0xc;
  trueContext.flags.m_bits._0_1_ = (undefined1)(context->flags).m_bits;
  trueContext.flags.m_bits._1_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 1);
  trueContext.flags.m_bits._2_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 2);
  trueContext.flags.m_bits._3_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 3);
  trueContext.flags.m_bits._4_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 4);
  trueContext.flags.m_bits._5_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 5);
  trueContext.flags.m_bits._6_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 6);
  trueContext.flags.m_bits._7_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 7);
  trueContext.instanceOrProc._0_1_ = *(undefined1 *)&context->instanceOrProc;
  trueContext.instanceOrProc._1_1_ = *(undefined1 *)((long)&context->instanceOrProc + 1);
  trueContext.instanceOrProc._2_1_ = *(undefined1 *)((long)&context->instanceOrProc + 2);
  trueContext.instanceOrProc._3_1_ = *(undefined1 *)((long)&context->instanceOrProc + 3);
  trueContext.instanceOrProc._4_1_ = *(undefined1 *)((long)&context->instanceOrProc + 4);
  trueContext.instanceOrProc._5_1_ = *(undefined1 *)((long)&context->instanceOrProc + 5);
  trueContext.instanceOrProc._6_1_ = *(undefined1 *)((long)&context->instanceOrProc + 6);
  trueContext.instanceOrProc._7_1_ = *(undefined1 *)((long)&context->instanceOrProc + 7);
  trueContext.firstTempVar = context->firstTempVar;
  trueContext.randomizeDetails = context->randomizeDetails;
  local_268 = (ConditionalExpression *)(syntax->predicate).ptr;
  uVar16 = (((ConditionalPredicateSyntax *)local_268)->conditions).elements._M_extent.
           _M_extent_value + 1;
  local_250 = context;
  local_230 = syntax;
  local_228 = comp;
  if (uVar16 < 2) {
    local_268._1_7_ = (undefined7)((ulong)local_268 >> 8);
    local_268 = (ConditionalExpression *)CONCAT71(local_268._1_7_,1);
    local_240 = 0;
    local_248 = 0;
    uVar16 = 0;
  }
  else {
    local_238 = (Token *)(uVar16 >> 1);
    uVar36 = 0;
    uVar30 = 0;
    uVar16 = 0;
    do {
      ppSVar17 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((((SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)
                              ((long)local_268 + 0x18))->elements)._M_ptr + uVar16 * 2));
      pSVar2 = *ppSVar17;
      pEVar20 = Expression::selfDetermined
                          (comp,*(ExpressionSyntax **)(pSVar2 + 1),&trueContext,
                           (bitmask<slang::ast::ASTFlags>)0x0);
      bVar12 = Expression::bad(pEVar20);
      uVar35 = (undefined7)(uVar36 >> 8);
      bVar34 = (byte)uVar36 | bVar12;
      uVar36 = CONCAT71(uVar35,bVar34);
      pSVar3 = pSVar2[1].parent;
      local_260 = pEVar20;
      if (pSVar3 == (SyntaxNode *)0x0) {
        bVar12 = Type::isFourState((pEVar20->type).ptr);
        uVar30 = CONCAT71((int7)((ulong)uVar30 >> 8),(byte)uVar30 | bVar12);
        if (bVar34 == 0) {
          bVar12 = ASTContext::requireBooleanConvertible(&trueContext,pEVar20);
          uVar36 = CONCAT71(extraout_var,bVar12) & 0xffffffff ^ 1;
          pIVar18 = (InvalidPattern *)0x0;
          goto LAB_0042c3d9;
        }
        uVar36 = CONCAT71(uVar35,1);
        pIVar18 = (InvalidPattern *)0x0;
      }
      else {
        pSVar3 = pSVar3[1].previewNode;
        pTVar37 = (pEVar20->type).ptr;
        vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len = 0;
        vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_ =
             (pointer)vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.firstElement;
        vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.cap = 5;
        bVar12 = Pattern::createPatternVars(&trueContext,(PatternSyntax *)pSVar3,pTVar37,&vars);
        if (bVar12) {
          varMap.super_Storage.ptr = (char *)&varMap;
          varMap._112_8_ = 0x3f;
          varMap._120_8_ = 1;
          varMap._128_16_ = ZEXT816(0x474ad0);
          varMap._144_16_ = (undefined1  [16])0x0;
          local_248 = uVar36;
          local_240 = uVar30;
          varMap.super_Storage._104_8_ = varMap.super_Storage.ptr;
          if (vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len != 0) {
            ppPVar28 = vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_ +
                       vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.len;
            ppPVar29 = vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_;
            local_220 = uVar16;
            do {
              local_258 = &(*ppPVar29)->super_TempVarSymbol;
              if ((local_258->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0)
              {
                sv = &(local_258->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
                hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)&varMap.super_Storage.field_0x68,sv);
                pos0 = hash >> (varMap._112_1_ & 0x3f);
                lVar31 = (hash & 0xff) * 4;
                cVar5 = (&UNK_00474b6c)[lVar31];
                cVar6 = (&UNK_00474b6d)[lVar31];
                cVar7 = (&UNK_00474b6e)[lVar31];
                bVar34 = (&UNK_00474b6f)[lVar31];
                uVar32 = 0;
                uVar36 = pos0;
                do {
                  pcVar1 = (char *)(varMap._128_8_ + uVar36 * 0x10);
                  bVar11 = pcVar1[0xf];
                  auVar38[0] = -(*pcVar1 == cVar5);
                  auVar38[1] = -(pcVar1[1] == cVar6);
                  auVar38[2] = -(pcVar1[2] == cVar7);
                  auVar38[3] = -(pcVar1[3] == bVar34);
                  auVar38[4] = -(pcVar1[4] == cVar5);
                  auVar38[5] = -(pcVar1[5] == cVar6);
                  auVar38[6] = -(pcVar1[6] == cVar7);
                  auVar38[7] = -(pcVar1[7] == bVar34);
                  auVar38[8] = -(pcVar1[8] == cVar5);
                  auVar38[9] = -(pcVar1[9] == cVar6);
                  auVar38[10] = -(pcVar1[10] == cVar7);
                  auVar38[0xb] = -(pcVar1[0xb] == bVar34);
                  auVar38[0xc] = -(pcVar1[0xc] == cVar5);
                  auVar38[0xd] = -(pcVar1[0xd] == cVar6);
                  auVar38[0xe] = -(pcVar1[0xe] == cVar7);
                  auVar38[0xf] = -(bVar11 == bVar34);
                  uVar14 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
                  if (uVar14 != 0) {
                    lVar33 = varMap._128_8_ + uVar36 * 0x10;
                    lVar31 = varMap._136_8_ + uVar36 * 0x168;
                    do {
                      uVar4 = 0;
                      if (uVar14 != 0) {
                        for (; (uVar14 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      __y = (basic_string_view<char,_std::char_traits<char>_> *)
                            (lVar31 + (ulong)uVar4 * 0x18);
                      bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)&varMap.super_Storage.field_0x68,sv,__y);
                      if (bVar12) {
                        pDVar24 = ASTContext::addDiag(&trueContext,(DiagCode)0x2a000a,
                                                      (local_258->super_VariableSymbol).
                                                      super_ValueSymbol.super_Symbol.location);
                        uVar16 = local_220;
                        Diagnostic::operator<<
                                  (pDVar24,(local_258->super_VariableSymbol).super_ValueSymbol.
                                           super_Symbol.name);
                        Diagnostic::addNote(pDVar24,(DiagCode)0x50001,
                                            *(SourceLocation *)(__y[1]._M_len + 0x18));
                        goto LAB_0042c074;
                      }
                      uVar14 = uVar14 - 1 & uVar14;
                    } while (uVar14 != 0);
                    bVar11 = *(byte *)(lVar33 + 0xf);
                    uVar16 = local_220;
                  }
                  if (((&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar11) == 0)
                  break;
                  lVar31 = uVar36 + uVar32;
                  uVar32 = uVar32 + 1;
                  uVar36 = lVar31 + 1U & varMap._120_8_;
                } while (uVar32 <= (ulong)varMap._120_8_);
                if ((ulong)varMap._152_8_ < (ulong)varMap._144_8_) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PatternVarSymbol_const*&>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                                   *)&varMap.super_Storage.field_0x68,
                             (arrays_type *)&varMap.field_0x70,pos0,hash,&local_269,sv,
                             (PatternVarSymbol **)&local_258);
                  varMap._152_8_ = varMap._152_8_ + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PatternVarSymbol_const*&>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>,96ul,16ul>>
                                   *)&varMap.super_Storage.field_0x68,hash,&local_269,sv,
                             (PatternVarSymbol **)&local_258);
                }
                pTVar10 = trueContext.firstTempVar;
                trueContext.firstTempVar = local_258;
                local_258->nextTemp = pTVar10;
                DeclaredType::forceResolveAt
                          (&(local_258->super_VariableSymbol).super_ValueSymbol.declaredType,
                           &trueContext);
              }
LAB_0042c074:
              ppPVar29 = ppPVar29 + 1;
            } while (ppPVar29 != ppPVar28);
          }
          iVar15 = Pattern::bind((int)&trueContext,(sockaddr *)pSVar3,(socklen_t)pTVar37);
          uVar30 = local_240;
          uVar36 = local_248;
          pIVar18 = (InvalidPattern *)CONCAT44(extraout_var_00,iVar15);
          res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                   varMap.super_Storage._104_8_;
          pEVar20 = local_260;
          comp = local_228;
          if (varMap._136_8_ != 0) {
            slang::detail::hashing::
            StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>
            ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_96UL,_16UL>
                          *)&res,(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                                  *)varMap._136_8_,(varMap._120_8_ * 0x178 + 0x186U) / 0x18);
            pEVar20 = local_260;
            comp = local_228;
          }
        }
        else {
          varMap.super_Storage.buffer[0] = '\0';
          varMap.super_Storage.buffer[1] = '\0';
          varMap.super_Storage.buffer[2] = '\0';
          varMap.super_Storage.buffer[3] = '\0';
          varMap.super_Storage.buffer[4] = '\0';
          varMap.super_Storage.buffer[5] = '\0';
          varMap.super_Storage.buffer[6] = '\0';
          varMap.super_Storage.buffer[7] = '\0';
          pIVar18 = BumpAllocator::emplace<slang::ast::InvalidPattern,decltype(nullptr)>
                              (&comp->super_BumpAllocator,(void **)&varMap);
        }
        if (vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_ !=
            (pointer)vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.firstElement)
        {
          operator_delete(vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>.data_);
        }
        uVar36 = CONCAT71((int7)(uVar36 >> 8),
                          (byte)uVar36 | (pIVar18->super_Pattern).kind == Invalid);
        isConst = false;
LAB_0042c3d9:
        if (((uVar36 & 1) == 0) && (isConst == true)) {
          ASTContext::tryEval((ConstantValue *)&varMap,&trueContext,pEVar20);
          if ((varMap.super_Storage.buffer[0x20] == '\0') ||
             ((varMap.super_Storage.buffer[0x20] == '\x01' &&
              (pvVar19 = std::
                         get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                   ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)&varMap), (pvVar19->super_SVIntStorage).unknownFlag == true))
             )) {
            isConst = false;
          }
          else {
            bVar12 = ConstantValue::isTrue((ConstantValue *)&varMap);
            if (!bVar12) {
              isTrue = false;
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&varMap);
        }
      }
      varMap.super_Storage.buffer._0_8_ = pEVar20;
      varMap.super_Storage.buffer._8_8_ = pIVar18;
      SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
      emplace_back<slang::ast::ConditionalExpression::Condition>
                (&conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>,
                 (Condition *)&varMap);
      uVar16 = uVar16 + 1;
    } while ((Token *)uVar16 != local_238);
    local_248 = uVar36 & 0xffffffffffffff01;
    local_268 = (ConditionalExpression *)CONCAT71(local_268._1_7_,isTrue);
    uVar16 = 0;
    local_240 = uVar30;
    if ((isConst & 1U) != 0) {
      uVar16 = (ulong)(((byte)~isTrue & 1) * 2);
    }
  }
  pCVar9 = local_228;
  pCVar8 = local_230;
  ctx = local_250;
  bVar12 = isConst;
  uVar36 = (local_250->flags).m_bits & 0x600;
  bVar27.m_bits = uVar16 + 0x200;
  if (uVar36 != 0x600) {
    bVar27.m_bits = uVar16;
  }
  local_260 = Expression::create(local_228,(local_230->left).ptr,&trueContext,bVar27,
                                 assignmentTarget);
  uVar16 = (ulong)(((bVar12 & (byte)local_268) & 1) * 2);
  bVar27.m_bits = uVar16 + 0x200;
  if ((int)uVar36 != 0x600) {
    bVar27.m_bits = uVar16;
  }
  pEVar20 = Expression::create(pCVar9,(pCVar8->right).ptr,ctx,bVar27,assignmentTarget);
  bVar12 = Expression::bad(local_260);
  bVar13 = true;
  if (!bVar12) {
    bVar13 = Expression::bad(pEVar20);
  }
  pTVar37 = (local_260->type).ptr;
  this_00 = (pEVar20->type).ptr;
  pTVar21 = pTVar37->canonical;
  if (pTVar21 == (Type *)0x0) {
    Type::resolveCanonical(pTVar37);
    pTVar21 = pTVar37->canonical;
  }
  pTVar22 = pCVar9->intType;
  if ((pTVar21->super_Symbol).kind == UnboundedType) {
    pTVar37 = pTVar22;
  }
  pTVar21 = this_00->canonical;
  if (pTVar21 == (Type *)0x0) {
    Type::resolveCanonical(this_00);
    pTVar21 = this_00->canonical;
    pTVar22 = pCVar9->intType;
  }
  if ((pTVar21->super_Symbol).kind == UnboundedType) {
    this_00 = pTVar22;
  }
  pTVar21 = OpInfo::binaryType(pCVar9,pTVar37,this_00,(bool)((byte)local_240 & 1),false);
  varMap.super_Storage.buffer._0_4_ =
       SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                 (&conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>,
                  (EVP_PKEY_CTX *)pCVar9,src);
  pCVar8 = local_230;
  varMap.super_Storage.buffer._4_4_ = extraout_var_01;
  local_238 = &local_230->question;
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
           parsing::Token::location(local_238);
  vars.super_SmallVectorBase<const_slang::ast::PatternVarSymbol_*>._0_16_ =
       slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pCVar8);
  pCVar9 = local_228;
  local_268 = BumpAllocator::
              emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,std::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::SourceLocation,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange,bool&,bool&>
                        (&local_228->super_BumpAllocator,pTVar21,
                         (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
                          *)&varMap,(SourceLocation *)&res,local_260,pEVar20,(SourceRange *)&vars,
                         &isConst,&isTrue);
  if ((char)local_248 != '\0' || bVar13 != false) {
    local_268 = (ConditionalExpression *)Expression::badExpr(pCVar9,&local_268->super_Expression);
    goto LAB_0042c8a2;
  }
  bVar12 = Type::isNumeric(pTVar37);
  if ((!bVar12) || (bVar12 = Type::isNumeric(this_00), !bVar12)) {
    pTVar21 = pTVar37->canonical;
    if (pTVar21 == (Type *)0x0) {
      Type::resolveCanonical(pTVar37);
      pTVar21 = pTVar37->canonical;
    }
    SVar26 = (pTVar21->super_Symbol).kind;
    if (SVar26 == NullType) {
      pTVar21 = this_00->canonical;
      if (pTVar21 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar21 = this_00->canonical;
      }
      if ((pTVar21->super_Symbol).kind != NullType) {
        pTVar21 = pTVar37->canonical;
        if (pTVar21 == (Type *)0x0) {
          Type::resolveCanonical(pTVar37);
          pTVar21 = pTVar37->canonical;
        }
        SVar26 = (pTVar21->super_Symbol).kind;
        goto LAB_0042c706;
      }
      pTVar22 = Compilation::getNullType(pCVar9);
      goto LAB_0042c78b;
    }
LAB_0042c706:
    if (SVar26 != ClassType) {
      pTVar22 = this_00->canonical;
      if (pTVar22 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar22 = this_00->canonical;
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar22->super_Symbol).kind == ClassType) {
LAB_0042c729:
        if (pTVar21 == (Type *)0x0) {
          Type::resolveCanonical(pTVar37);
          pTVar21 = pTVar37->canonical;
        }
        goto LAB_0042c73a;
      }
      if (pTVar21 == (Type *)0x0) {
        Type::resolveCanonical(pTVar37);
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar21->super_Symbol).kind == CHandleType) goto LAB_0042c75b;
      pTVar22 = this_00->canonical;
      if (pTVar22 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar22 = this_00->canonical;
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar22->super_Symbol).kind == CHandleType) goto LAB_0042c729;
      if (pTVar21 == (Type *)0x0) {
        Type::resolveCanonical(pTVar37);
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar21->super_Symbol).kind == EventType) goto LAB_0042c75b;
      pTVar22 = this_00->canonical;
      if (pTVar22 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar22 = this_00->canonical;
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar22->super_Symbol).kind == EventType) goto LAB_0042c729;
      if (pTVar21 == (Type *)0x0) {
        Type::resolveCanonical(pTVar37);
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar21->super_Symbol).kind == VirtualInterfaceType) goto LAB_0042c75b;
      pTVar22 = this_00->canonical;
      if (pTVar22 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar22 = this_00->canonical;
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar22->super_Symbol).kind == VirtualInterfaceType) goto LAB_0042c729;
      if (pTVar21 == (Type *)0x0) {
        Type::resolveCanonical(pTVar37);
        pTVar21 = pTVar37->canonical;
      }
      if ((pTVar21->super_Symbol).kind == CovergroupType) goto LAB_0042c75b;
      pTVar21 = this_00->canonical;
      if (pTVar21 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar21 = this_00->canonical;
      }
      if ((pTVar21->super_Symbol).kind == CovergroupType) {
        pTVar21 = pTVar37->canonical;
        goto LAB_0042c729;
      }
      bVar12 = Type::isEquivalent(pTVar37,this_00);
      pTVar22 = pTVar37;
      if (bVar12) goto LAB_0042c78b;
      bVar12 = Expression::isImplicitString(local_260);
      if ((bVar12) && (bVar12 = Expression::isImplicitString(pEVar20), bVar12)) {
        pTVar22 = pCVar9->stringType;
        goto LAB_0042c78b;
      }
LAB_0042c90d:
      SVar23 = parsing::Token::location(local_238);
      pDVar24 = ASTContext::addDiag(local_250,(DiagCode)0x220007,SVar23);
      pDVar25 = ast::operator<<(pDVar24,pTVar37);
      ast::operator<<(pDVar25,this_00);
      Diagnostic::operator<<(pDVar24,local_260->sourceRange);
      Diagnostic::operator<<(pDVar24,pEVar20->sourceRange);
      local_268 = (ConditionalExpression *)Expression::badExpr(pCVar9,&local_268->super_Expression);
      goto LAB_0042c8a2;
    }
LAB_0042c73a:
    pTVar22 = this_00;
    if ((pTVar21->super_Symbol).kind != NullType) {
LAB_0042c75b:
      pTVar21 = this_00->canonical;
      if (pTVar21 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar21 = this_00->canonical;
      }
      pTVar22 = pTVar37;
      if (((((pTVar21->super_Symbol).kind != NullType) &&
           (bVar12 = Type::isAssignmentCompatible(this_00,pTVar37), pTVar22 = this_00, !bVar12)) &&
          (bVar12 = Type::isAssignmentCompatible(pTVar37,this_00), pTVar22 = pTVar37, !bVar12)) &&
         ((pTVar22 = Type::getCommonBase(pTVar37,this_00), pTVar22 == (Type *)0x0 &&
          (bVar12 = Type::isEquivalent(pTVar37,this_00), pTVar22 = pTVar37, !bVar12))))
      goto LAB_0042c90d;
    }
LAB_0042c78b:
    (local_268->super_Expression).type.ptr = pTVar22;
  }
  if (((((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.len == 1)
        && ((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_)->
            pattern == (Pattern *)0x0)) &&
       (this = ((conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
                data_)->expr).ptr, this->kind == BinaryOp)) &&
      (bVar12 = Expression::isParenthesized(this), !bVar12)) &&
     ((bVar12 = OpInfo::isArithmetic(*(BinaryOperator *)&this[1].constant), bVar12 ||
      (bVar12 = OpInfo::isShift(*(BinaryOperator *)&this[1].constant), bVar12)))) {
    arg = OpInfo::getText(*(BinaryOperator *)&this[1].constant);
    SVar23 = parsing::Token::location(local_238);
    pDVar24 = ASTContext::addDiag(local_250,(DiagCode)0xbc0007,SVar23);
    pDVar25 = Diagnostic::operator<<(pDVar24,arg);
    pDVar25 = Diagnostic::operator<<(pDVar25,arg);
    Diagnostic::operator<<(pDVar25,this->sourceRange);
    range.endLoc = (pEVar20->sourceRange).endLoc;
    range.startLoc = (SourceLocation)((this[1].type.ptr)->super_Symbol).parentScope;
    Diagnostic::addNote(pDVar24,(DiagCode)0xaf0007,range);
    pDVar24 = Diagnostic::addNote(pDVar24,(DiagCode)0xb30007,this->sourceRange);
    Diagnostic::operator<<(pDVar24,arg);
  }
  syntax_00._M_ptr =
       (local_230->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (local_230->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  ASTContext::setAttributes(local_250,&local_268->super_Expression,syntax_00);
LAB_0042c8a2:
  if (conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.data_ !=
      (pointer)conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
               firstElement) {
    operator_delete(conditions.super_SmallVectorBase<slang::ast::ConditionalExpression::Condition>.
                    data_);
  }
  return &local_268->super_Expression;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            pattern = createPattern(comp, trueContext, *condSyntax->matchesClause->pattern,
                                    *cond.type);
            bad |= pattern->bad();

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = OpInfo::binaryType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp),
                                                      syntax.question.location(), left, right,
                                                      syntax.sourceRange(), isConst, isTrue);
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt)) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    // Warn about cases where a conditional expression and a binary operator
    // are mixed in a way that suggests the user mixed up the precedence order.
    // ex: `a + b ? 1 : 2`
    if (conditions.size() == 1 && !conditions[0].pattern) {
        if (auto binOp = conditions[0].expr->as_if<BinaryExpression>();
            binOp && !binOp->isParenthesized()) {
            if (OpInfo::isArithmetic(binOp->op) || OpInfo::isShift(binOp->op)) {
                auto opStr = OpInfo::getText(binOp->op);
                auto& diag = context.addDiag(diag::ConditionalPrecedence,
                                             syntax.question.location());
                diag << opStr << opStr << binOp->sourceRange;

                SourceRange range(binOp->right().sourceRange.start(), right.sourceRange.end());
                diag.addNote(diag::NoteConditionalPrecedenceFix, range);
                diag.addNote(diag::NotePrecedenceSilence, binOp->sourceRange) << opStr;
            }
        }
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}